

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomOneAction.cpp
# Opt level: O0

ActionResults * __thiscall WhiteRoomOneAction::Throw(WhiteRoomOneAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ActionResults *pAVar4;
  bool bVar5;
  allocator local_81;
  string local_80 [32];
  itemType local_60 [2];
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  itemType local_20 [2];
  WhiteRoomOneAction *local_18;
  WhiteRoomOneAction *this_local;
  
  local_18 = this;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  bVar5 = false;
  if (iVar1 == DISCUS) {
    local_20[1] = 0x29;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_20 + 1);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    bVar5 = false;
    if (iVar2 == BACKPACK) {
      iVar1 = Command::getActedOnItem((this->super_AbstractRoomAction).commands);
      bVar5 = iVar1 == LIGHT;
    }
  }
  if (bVar5) {
    local_20[0] = LADDER;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_20);
    ItemWrapper::setLocation(pIVar3,W_ROOM1);
    pAVar4 = (ActionResults *)operator_new(0x30);
    local_55 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "Good shootin\' Tex! The floor drops out in part of the room and the top of an escape ladder juts out of the newly formed hole."
               ,&local_41);
    ActionResults::ActionResults(pAVar4,CURRENT,(string *)local_40);
    local_55 = 0;
    this_local = (WhiteRoomOneAction *)pAVar4;
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    bVar5 = false;
    if (iVar1 == DISCUS) {
      local_60[1] = 0x29;
      pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_60 + 1);
      iVar2 = ItemWrapper::getLocation(pIVar3);
      bVar5 = iVar2 == BACKPACK;
    }
    if (bVar5) {
      local_60[0] = DISCUS;
      pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_60);
      ItemWrapper::setLocation(pIVar3,W_ROOM1);
      pAVar4 = (ActionResults *)operator_new(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_80,
                 "The discus floats in the air like a frisbee before crashing into a wall and rolling around on the floor."
                 ,&local_81);
      ActionResults::ActionResults(pAVar4,CURRENT,(string *)local_80);
      this_local = (WhiteRoomOneAction *)pAVar4;
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    else {
      this_local = (WhiteRoomOneAction *)AbstractRoomAction::Throw(&this->super_AbstractRoomAction);
    }
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults *WhiteRoomOneAction::Throw() {
    if(commands->getMainItem() == DISCUS && itemList->getValue(DISCUS)->getLocation() == BACKPACK && commands->getActedOnItem() == LIGHT){
        itemList->getValue(LADDER)->setLocation(W_ROOM1); //unhide ladder
        return new ActionResults(CURRENT, "Good shootin' Tex! The floor drops out in part of the room and the top of an escape ladder juts out of the newly formed hole.");
    }
    if(commands->getMainItem() == DISCUS && itemList->getValue(DISCUS)->getLocation() == BACKPACK) {
        itemList->getValue(DISCUS)->setLocation(W_ROOM1);
        return new ActionResults(CURRENT, "The discus floats in the air like a frisbee before crashing into a wall and rolling around on the floor.");
    }
    else {
        return AbstractRoomAction::Throw();
    }
}